

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O1

void __thiscall
cmFindProgramCommand::cmFindProgramCommand(cmFindProgramCommand *this,cmExecutionStatus *status)

{
  cmMakefile *this_00;
  PolicyStatus PVar1;
  int iVar2;
  string_view value;
  string local_70;
  string local_50;
  cmValue local_30;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"find_program","");
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_50,status);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_00b3ee10;
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x8d1b37);
  (this->super_cmFindBase).VariableType = FILEPATH;
  PVar1 = cmMakefile::GetPolicyStatus
                    ((this->super_cmFindBase).super_cmFindCommon.Makefile,CMP0134,false);
  if (PVar1 == NEW) {
    (this->super_cmFindBase).super_cmFindCommon.RegistryView = Both;
  }
  else {
    this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_SIZEOF_VOID_P","");
    local_30 = cmMakefile::GetDefinition(this_00,&local_70);
    value._M_str = "8";
    value._M_len = 1;
    iVar2 = cmValue::Compare(&local_30,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg64_32;
    }
    else {
      (this->super_cmFindBase).super_cmFindCommon.RegistryView = Reg32_64;
    }
  }
  return;
}

Assistant:

cmFindProgramCommand::cmFindProgramCommand(cmExecutionStatus& status)
  : cmFindBase("find_program", status)
{
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a program.";
  this->VariableType = cmStateEnums::FILEPATH;
  // Windows Registry views
  // When policy CMP0134 is not NEW, rely on previous behavior:
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0134) !=
      cmPolicies::NEW) {
    if (this->Makefile->GetDefinition("CMAKE_SIZEOF_VOID_P") == "8") {
      this->RegistryView = cmWindowsRegistry::View::Reg64_32;
    } else {
      this->RegistryView = cmWindowsRegistry::View::Reg32_64;
    }
  } else {
    this->RegistryView = cmWindowsRegistry::View::Both;
  }
}